

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O0

void ircode_dump(void *_code)

{
  opcode_t op_00;
  opcode_t oVar1;
  opcode_t n_00;
  opcode_t oVar2;
  long lVar3;
  opcode_t *poVar4;
  uint32_t uVar5;
  char *pcVar6;
  char *pcVar7;
  uint8_t local_49;
  uint8_t n;
  int32_t p3;
  int32_t p2;
  int32_t p1;
  opcode_t op;
  inst_t *inst;
  uint local_28;
  uint32_t line;
  uint32_t i;
  uint32_t count;
  code_r *list;
  ircode_t *code;
  void *_code_local;
  
  lVar3 = *_code;
  uVar5 = ircode_count((ircode_t *)_code);
  if (uVar5 == 0) {
    printf("NONE\n");
  }
  else {
    inst._4_4_ = 0;
    for (local_28 = 0; local_28 < uVar5; local_28 = local_28 + 1) {
      poVar4 = *(opcode_t **)(*(long *)(lVar3 + 0x10) + (ulong)local_28 * 8);
      op_00 = *poVar4;
      oVar1 = poVar4[2];
      n_00 = poVar4[3];
      oVar2 = poVar4[4];
      if ((poVar4[1] != CALL) && (poVar4[1] != LOADAT)) {
        if (poVar4[1] == RET) {
          printf("LABEL %d:\n",(ulong)oVar1);
        }
        else {
          local_49 = opcode_numop(op_00);
          if ((op_00 == SETLIST) && (n_00 == RET0)) {
            local_49 = '\x02';
          }
          switch(local_49) {
          case '\0':
            pcVar7 = opcode_name(op_00);
            printf("%05d\t%s\n",(ulong)inst._4_4_,pcVar7);
          case '\x01':
            pcVar7 = opcode_name(op_00);
            printf("%05d\t%s %d\n",(ulong)inst._4_4_,pcVar7,(ulong)oVar1);
            break;
          case '\x02':
            if (op_00 == LOADI) {
              if (poVar4[1] == NOP) {
                pcVar7 = opcode_name(LOADI);
                printf("%05d\t%s %d %.2f\n",*(undefined8 *)(poVar4 + 6),(ulong)inst._4_4_,pcVar7,
                       (ulong)oVar1);
              }
              else {
                pcVar7 = opcode_name(LOADI);
                printf("%05d\t%s %d %ld\n",(ulong)inst._4_4_,pcVar7,(ulong)oVar1,
                       *(undefined8 *)(poVar4 + 6));
              }
            }
            else if (op_00 == LOADK) {
              if ((int)n_00 < 0x1000) {
                pcVar7 = opcode_name(LOADK);
                printf("%05d\t%s %d %d\n",(ulong)inst._4_4_,pcVar7,(ulong)oVar1,(ulong)n_00);
              }
              else {
                pcVar7 = opcode_name(LOADK);
                pcVar6 = opcode_constname(n_00);
                printf("%05d\t%s %d %s\n",(ulong)inst._4_4_,pcVar7,(ulong)oVar1,pcVar6);
              }
            }
            else {
              pcVar7 = opcode_name(op_00);
              printf("%05d\t%s %d %d\n",(ulong)inst._4_4_,pcVar7,(ulong)oVar1,(ulong)n_00);
            }
            break;
          case '\x03':
            pcVar7 = opcode_name(op_00);
            printf("%05d\t%s %d %d %d\n",(ulong)inst._4_4_,pcVar7,(ulong)oVar1,(ulong)n_00,
                   (ulong)oVar2);
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_ircode.c"
                          ,0x142,"void ircode_dump(void *)");
          }
          inst._4_4_ = inst._4_4_ + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void ircode_dump (void *_code) {
    ircode_t    *code = (ircode_t *)_code;
    code_r      *list = code->list;
    uint32_t    count = ircode_count(code);

    if (count == 0) {
        printf("NONE\n");
        return;
    }

    for (uint32_t i=0, line=0; i<count; ++i) {
        inst_t      *inst = marray_get(*list, i);
        opcode_t    op = inst->op;
        int32_t     p1 = inst->p1;
        int32_t     p2 = inst->p2;
        int32_t     p3 = inst->p3;
        if (inst->tag == SKIP_TAG) continue;
        if (inst->tag == PRAGMA_MOVE_OPTIMIZATION) continue;
        if (inst->tag == LABEL_TAG) {printf("LABEL %d:\n", p1); continue;}

        uint8_t n = opcode_numop(op);
        if ((op == SETLIST) && (p2 == 0)) n = 2;
        
        // set to 1 to debug line number for each instruction
        #if 0
        printf("(%d)\t\t", inst->lineno);
        #endif
        
        switch (n) {
            case 0: {
                printf("%05d\t%s\n", line, opcode_name(op));
            }

            case 1: {
                printf("%05d\t%s %d\n", line, opcode_name(op), p1);
            } break;

            case 2: {
                if (op == LOADI) {
                    if (inst->tag == DOUBLE_TAG) printf("%05d\t%s %d %.2f\n", line, opcode_name(op), p1, inst->d);
                    #if defined(_WIN32)
                    else printf("%05d\t%s %d %I64d\n", line, opcode_name(op), p1, inst->n);
                    #else
                    else printf("%05d\t%s %d %"PRId64"\n", line, opcode_name(op), p1, inst->n);
                    #endif
                } else if (op == LOADK) {
                    if (p2 < CPOOL_INDEX_MAX) printf("%05d\t%s %d %d\n", line, opcode_name(op), p1, p2);
                    else printf("%05d\t%s %d %s\n", line, opcode_name(op), p1, opcode_constname(p2));
                } else {
                    printf("%05d\t%s %d %d\n", line, opcode_name(op), p1, p2);
                }
            } break;

            case 3: {
                printf("%05d\t%s %d %d %d\n", line, opcode_name(op), p1, p2, p3);
            } break;

            default: assert(0);
        }
        ++line;
    }
}